

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect_socket.cpp
# Opt level: O0

bool __thiscall cppnet::ConnectSocket::Listen(ConnectSocket *this)

{
  SysCallInt32Result SVar1;
  SingletonLogger *this_00;
  char *pcVar2;
  int local_20;
  uint32_t uStack_1c;
  SysCallInt32Result ret;
  ConnectSocket *this_local;
  
  SVar1 = OsHandle::Listen((this->super_Socket)._sock,0);
  local_20 = SVar1._return_value;
  if (-1 < local_20) {
    SocketNoblocking((this->super_Socket)._sock);
    (*(this->super_Socket)._vptr_Socket[4])();
  }
  else {
    this_00 = Singleton<cppnet::SingletonLogger>::Instance();
    uStack_1c = SVar1._errno;
    pcVar2 = ErrnoInfo(uStack_1c);
    SingletonLogger::Fatal
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/socket/connect_socket.cpp"
               ,0x42,"listen socket filed! error:%d, info:%s",(ulong)uStack_1c,pcVar2);
    OsHandle::Close((this->super_Socket)._sock);
  }
  return -1 < local_20;
}

Assistant:

bool ConnectSocket::Listen() {
    auto ret = OsHandle::Listen(_sock);
#ifndef __win__ // WEPOLL don't support reuse_port
    if (ret._return_value < 0 && __reuse_port) {
        LOG_FATAL("listen socket filed! error:%d, info:%s", ret._errno, ErrnoInfo(ret._errno));
        OsHandle::Close(_sock);
        return false;
    }
#endif

    //set the socket noblocking
    SocketNoblocking(_sock);

    Accept();

    return true;
}